

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TiledOutputFile::writeTiles
          (TiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  value_type pTVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  ostream *poVar5;
  TileBufferTask *this_00;
  Data *this_01;
  void *pvVar6;
  size_type sVar7;
  reference ppTVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  TiledOutputFile *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  Data *in_stack_00000018;
  OutputStreamMutex *in_stack_00000020;
  char *in_stack_00000030;
  int in_stack_00000038;
  stringstream _iex_replace_s;
  BaseExc *e;
  TileBuffer *tileBuffer;
  size_t i;
  string *exception;
  TileBuffer *writeBuffer;
  int dyWrite;
  int dxWrite;
  int nextWriteBuffer;
  int dyComp;
  int dxComp;
  int nextCompBuffer;
  TaskGroup taskGroup;
  int numTasks;
  int numTiles;
  int dY;
  int dyStart;
  stringstream _iex_throw_s;
  lock_guard<std::mutex> lock;
  _Base_ptr in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  Data *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  Data *in_stack_fffffffffffffbf0;
  Data *ofd;
  TaskGroup *in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  size_type local_210;
  string *local_208;
  int local_1f4;
  uint local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1d4;
  int local_1d0;
  int local_1cc [3];
  stringstream local_1c0 [16];
  ostream local_1b0 [404];
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c [3];
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
             ,(mutex_type *)in_stack_fffffffffffffba8);
  sVar3 = std::
          vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
          ::size(&in_RDI->_data->slices);
  if (sVar3 == 0) {
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (char *)in_stack_fffffffffffffba8);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  bVar2 = isValidTile(in_RDI,local_c[0],local_14,local_1c,in_stack_00000008);
  if ((!bVar2) || (bVar2 = isValidTile(in_RDI,local_10,local_18,local_1c,in_stack_00000008), !bVar2)
     ) {
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (char *)in_stack_fffffffffffffba8);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  bVar2 = isValidLevel((TiledOutputFile *)
                       CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar5 = std::operator<<(local_1b0,"Level coordinate (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000008);
    std::operator<<(poVar5,") is invalid.");
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (stringstream *)in_stack_fffffffffffffba8);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if (local_10 < local_c[0]) {
    std::swap<int>(local_c,&local_10);
  }
  if (local_18 < local_14) {
    std::swap<int>(&local_14,&local_18);
  }
  local_1cc[2] = local_14;
  local_1cc[1] = 1;
  if (in_RDI->_data->lineOrder == DECREASING_Y) {
    local_1cc[2] = local_18;
    local_1cc[1] = 0xffffffff;
  }
  local_1cc[0] = ((local_10 - local_c[0]) + 1) * ((local_18 - local_14) + 1);
  sVar3 = std::
          vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
          ::size(&in_RDI->_data->tileBuffers);
  local_1d4 = (int)sVar3;
  this_00 = (TileBufferTask *)std::min<int>(&local_1d4,local_1cc);
  local_1d0 = *(int *)&(this_00->super_Task)._vptr_Task;
  IlmThread_3_3::TaskGroup::TaskGroup((TaskGroup *)in_stack_fffffffffffffbc0);
  local_1e4 = 0;
  local_1e8 = local_c[0];
  while (local_1e4 < local_1d0) {
    in_stack_fffffffffffffbf8 = (TaskGroup *)operator_new(0x20);
    local_1e4 = local_1e4 + 1;
    in_stack_fffffffffffffba8 =
         (_Base_ptr)CONCAT44((int)((ulong)in_stack_fffffffffffffba8 >> 0x20),local_1c);
    in_stack_fffffffffffffbb0 = in_stack_00000008;
    anon_unknown_5::TileBufferTask::TileBufferTask
              (this_00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),(int)in_stack_fffffffffffffbe8,
               (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffc10,
               (int)in_stack_fffffffffffffc18);
    IlmThread_3_3::ThreadPool::addGlobalTask((Task *)0x19c5b1);
    local_1e8 = local_1e8 + 1;
    if (local_10 < local_1e8) {
      local_1e8 = local_c[0];
    }
  }
  local_1f0 = 0;
  local_1f4 = local_c[0];
  while ((int)local_1f0 < local_1cc[0]) {
    pvVar6 = (void *)(ulong)local_1f0;
    this_01 = (Data *)Data::getTileBuffer(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
    ofd = this_01;
    anon_unknown_5::TileBuffer::wait((TileBuffer *)this_01,pvVar6);
    in_stack_fffffffffffffba8 =
         (this_01->header)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    in_stack_fffffffffffffbb0 =
         *(int *)&(this_01->header)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    anon_unknown_5::bufferedTileWrite
              (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
               in_stack_0000000c,in_stack_00000008,in_stack_00000030,in_stack_00000038);
    anon_unknown_5::TileBuffer::post((TileBuffer *)0x19c711);
    if (local_1e4 < local_1cc[0]) {
      pvVar6 = operator_new(0x20);
      in_stack_fffffffffffffba8 =
           (_Base_ptr)CONCAT44((int)((ulong)in_stack_fffffffffffffba8 >> 0x20),local_1c);
      in_stack_fffffffffffffbb0 = in_stack_00000008;
      anon_unknown_5::TileBufferTask::TileBufferTask
                (this_00,in_stack_fffffffffffffbf8,ofd,(int)((ulong)pvVar6 >> 0x20),(int)pvVar6,
                 (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffc10,
                 (int)in_stack_fffffffffffffc18);
      IlmThread_3_3::ThreadPool::addGlobalTask((Task *)0x19c791);
    }
    local_1f0 = local_1f0 + 1;
    local_1f4 = local_1f4 + 1;
    if (local_10 < local_1f4) {
      local_1f4 = local_c[0];
    }
    local_1e4 = local_1e4 + 1;
    local_1e8 = local_1e8 + 1;
    if (local_10 < local_1e8) {
      local_1e8 = local_c[0];
    }
  }
  IlmThread_3_3::TaskGroup::~TaskGroup
            ((TaskGroup *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  local_208 = (string *)0x0;
  local_210 = 0;
  while (sVar3 = local_210,
        sVar7 = std::
                vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                ::size(&in_RDI->_data->tileBuffers), sVar3 < sVar7) {
    ppTVar8 = std::
              vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[](&in_RDI->_data->tileBuffers,local_210);
    pTVar1 = *ppTVar8;
    if (((pTVar1->hasException & 1U) != 0) && (local_208 == (string *)0x0)) {
      local_208 = &pTVar1->exception;
    }
    pTVar1->hasException = false;
    local_210 = local_210 + 1;
  }
  if (local_208 == (string *)0x0) {
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19c9d1);
    return;
  }
  uVar4 = __cxa_allocate_exception(0x48);
  Iex_3_3::IoExc::IoExc
            ((IoExc *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             (string *)in_stack_fffffffffffffba8);
  __cxa_throw(uVar4,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
}

Assistant:

void
TiledOutputFile::writeTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2) swap (dx1, dx2);

        if (dy1 > dy2) swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int) _data->tileBuffers.size (), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (
                    &taskGroup,
                    _data,
                    nextCompBuffer++,
                    dxComp,
                    dyComp,
                    lx,
                    ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite (
                    _streamData,
                    _data,
                    dxWrite,
                    dyWrite,
                    lx,
                    ly,
                    writeBuffer->dataPtr,
                    writeBuffer->dataSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post ();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask (new TileBufferTask (
                        &taskGroup,
                        _data,
                        nextCompBuffer,
                        dxComp,
                        dyComp,
                        lx,
                        ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}